

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

void __thiscall Messages::Person::MergeFrom(Person *this,Person *from)

{
  uint uVar1;
  string *psVar2;
  string *psVar3;
  LogMessage *pLVar4;
  Arena *pAVar5;
  LogFinisher local_59;
  LogMessage local_58 [56];
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O3/proto/messages.pb.cc"
               ,0x2f0);
    pLVar4 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(local_58);
  }
  if ((*(ulong *)&from->field_0x8 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,
               (UnknownFieldSet *)((*(ulong *)&from->field_0x8 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::TypeHandler>
            (&(this->phones_).super_RepeatedPtrFieldBase,&(from->phones_).super_RepeatedPtrFieldBase
            );
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar2 = (from->name_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar5 = *(Arena **)&this->field_0x8;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      psVar3 = (this->name_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar5,psVar2);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar3);
      }
    }
    if ((uVar1 & 2) != 0) {
      psVar2 = (from->email_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pAVar5 = *(Arena **)&this->field_0x8;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      psVar3 = (this->email_).ptr_;
      if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstance(&this->email_,pAVar5,psVar2);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar3);
      }
    }
    if ((uVar1 & 4) != 0) {
      this->id_ = from->id_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void Person::MergeFrom(const Person& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:Messages.Person)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  phones_.MergeFrom(from.phones_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_email(from._internal_email());
    }
    if (cached_has_bits & 0x00000004u) {
      id_ = from.id_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}